

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddCount.c
# Opt level: O1

double cuddZddCountDoubleStep(DdNode *P,st__table *table,DdNode *base,DdNode *empty)

{
  int iVar1;
  double dVar2;
  double *dummy;
  double *local_38;
  double local_30;
  double local_28;
  
  if (P != empty) {
    if (P == base) {
      dVar2 = 1.0;
    }
    else {
      iVar1 = st__lookup(table,(char *)P,(char **)&local_38);
      if (iVar1 == 0) {
        local_30 = cuddZddCountDoubleStep((P->type).kids.E,table,base,empty);
        local_28 = cuddZddCountDoubleStep((P->type).kids.T,table,base,empty);
        local_38 = (double *)malloc(8);
        dVar2 = -1.0;
        if (local_38 != (double *)0x0) {
          local_30 = local_30 + local_28;
          *local_38 = local_30;
          iVar1 = st__insert(table,(char *)P,(char *)local_38);
          dVar2 = local_30;
          if (iVar1 == -10000) {
            if (local_38 != (double *)0x0) {
              free(local_38);
            }
            dVar2 = -1.0;
          }
        }
      }
      else {
        dVar2 = *local_38;
      }
    }
    return dVar2;
  }
  return 0.0;
}

Assistant:

static double
cuddZddCountDoubleStep(
  DdNode * P,
  st__table * table,
  DdNode * base,
  DdNode * empty)
{
    double      res;
    double      *dummy;

    if (P == empty)
        return((double)0.0);
    if (P == base)
        return((double)1.0);

    /* Check cache */
    if ( st__lookup(table, (const char *)P, (char **)&dummy)) {
        res = *dummy;
        return(res);
    }

    res = cuddZddCountDoubleStep(cuddE(P), table, base, empty) +
        cuddZddCountDoubleStep(cuddT(P), table, base, empty);

    dummy = ABC_ALLOC(double, 1);
    if (dummy == NULL) {
        return((double)CUDD_OUT_OF_MEM);
    }
    *dummy = res;
    if ( st__insert(table, (char *)P, (char *)dummy) == st__OUT_OF_MEM) {
        ABC_FREE(dummy);
        return((double)CUDD_OUT_OF_MEM);
    }

    return(res);

}